

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfs.c
# Opt level: O3

Header * arcfs_read_header(FILE *ifp)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  Halfword HVar9;
  Halfword HVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  Byte BVar13;
  Byte BVar14;
  int iVar15;
  Word WVar16;
  Word WVar17;
  Word WVar18;
  Word WVar19;
  Word WVar20;
  Word WVar21;
  Word WVar22;
  Header *pHVar23;
  Byte BVar24;
  uint uVar25;
  char *fmt;
  arcfs_header paVar26;
  arcfs_header paVar27;
  long lVar28;
  Byte name [12];
  uint local_48;
  Byte local_3c [11];
  undefined1 local_31;
  
  if (arcfs_initialised == '\x01') {
    if (header_ptr != (arcfs_header)0x0) {
      pHVar23 = header_ptr->header;
      if ((header_ptr->is_dir != '\0') ||
         (iVar15 = fseek((FILE *)ifp,(ulong)header_ptr->seek,0), iVar15 == 0)) {
LAB_00103ced:
        arcfs_maxbits = (uint)header_ptr->maxbits;
        header_ptr = header_ptr->next;
        return pHVar23;
      }
      error("Cannot seek compressed data in this file");
    }
  }
  else {
    arcfs_initialised = '\x01';
    null_header.comptype = '\0';
    null_header.name[0] = '\0';
    null_header.name[1] = '\0';
    null_header.name[2] = '\0';
    null_header.name[3] = '\0';
    null_header.name[4] = '\0';
    null_header.name[5] = '\0';
    null_header.name[6] = '\0';
    null_header.name[7] = '\0';
    null_header.name[8] = '\0';
    null_header.name[9] = '\0';
    null_header.name[10] = '\0';
    null_header.name[0xb] = '\0';
    null_header.name[0xc] = '\0';
    null_header.name[0xd] = '\0';
    null_header._15_1_ = 0;
    null_header.complen = 0;
    null_header.date = 0;
    null_header.time = 0;
    null_header.crc = 0;
    null_header._26_2_ = 0;
    null_header.origlen = 0;
    null_header.load = 0;
    null_header.exec = 0;
    null_header.attr = 0;
    WVar16 = read_word(ifp);
    WVar17 = read_word(ifp);
    WVar18 = read_word(ifp);
    if (WVar18 < 0x29) {
      read_word(ifp);
      WVar18 = read_word(ifp);
      if (WVar18 == 0) {
        iVar15 = 0x11;
        do {
          read_word(ifp);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        if (0x23 < WVar16) {
          local_48 = WVar16 / 0x24;
          uVar25 = 0;
          paVar26 = (arcfs_header)0x0;
          do {
            pHVar23 = (Header *)malloc(0x2c);
            header_ptr = (arcfs_header)malloc(0x20);
            if ((pHVar23 == (Header *)0x0) || (header_ptr == (arcfs_header)0x0)) {
              fmt = "Out of memory";
              goto LAB_00103d0a;
            }
            BVar13 = read_byte(ifp);
            lVar28 = 0;
            do {
              BVar14 = read_byte(ifp);
              if (BVar14 == '/') {
                BVar14 = '_';
              }
              BVar24 = '\0';
              if (0xa0 < (byte)(BVar14 + 0x81)) {
                BVar24 = BVar14;
              }
              local_3c[lVar28] = BVar24;
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0xb);
            local_31 = 0;
            WVar16 = read_word(ifp);
            WVar18 = read_word(ifp);
            WVar19 = read_word(ifp);
            WVar20 = read_word(ifp);
            WVar21 = read_word(ifp);
            WVar22 = read_word(ifp);
            paVar27 = header_ptr;
            if (BVar13 == '\x01') {
              free(pHVar23);
              free(header_ptr);
              paVar27 = paVar26;
            }
            else {
              header_ptr->is_dir = (byte)(WVar22 >> 0x1f);
              paVar27->info_byte = BVar13;
              paVar27->info_word = WVar22;
              paVar27->maxbits = (Byte)(WVar20 >> 8);
              paVar27->seek = (WVar22 & 0x7fffffff) + WVar17;
              pHVar23->comptype = BVar13;
              strcpy(pHVar23->name,(char *)local_3c);
              pHVar23->complen = WVar21;
              pHVar23->date = 0;
              pHVar23->time = 0;
              pHVar23->crc = (Halfword)(WVar20 >> 0x10);
              pHVar23->origlen = WVar16;
              pHVar23->load = WVar18;
              pHVar23->exec = WVar19;
              pHVar23->attr = WVar20 & 0xff;
              arcfs_fixtime(pHVar23);
              uVar8 = null_header._36_8_;
              WVar16 = null_header.load;
              paVar27 = header_ptr;
              if (BVar13 == '\0') {
                pHVar23->origlen = null_header.origlen;
                uVar12 = null_header._36_8_;
                pHVar23->load = WVar16;
                null_header.exec = (Word)uVar8;
                null_header.attr = SUB84(uVar8,4);
                WVar18 = null_header.attr;
                pHVar23->exec = null_header.exec;
                null_header._36_8_ = uVar12;
                WVar16 = null_header.origlen;
                uVar11 = null_header._24_4_;
                pHVar23->attr = WVar18;
                HVar9 = null_header.date;
                HVar10 = null_header.time;
                pHVar23->complen = null_header.complen;
                pHVar23->date = HVar9;
                pHVar23->time = HVar10;
                pHVar23->crc = (short)uVar11;
                uVar8 = null_header._8_8_;
                *(short *)&pHVar23->field_0x1a = SUB42(uVar11,2);
                pHVar23->origlen = WVar16;
                cVar1 = null_header.name[0];
                cVar2 = null_header.name[1];
                cVar3 = null_header.name[2];
                cVar4 = null_header.name[3];
                cVar5 = null_header.name[4];
                cVar6 = null_header.name[5];
                cVar7 = null_header.name[6];
                pHVar23->comptype = null_header.comptype;
                pHVar23->name[0] = cVar1;
                pHVar23->name[1] = cVar2;
                pHVar23->name[2] = cVar3;
                pHVar23->name[3] = cVar4;
                pHVar23->name[4] = cVar5;
                pHVar23->name[5] = cVar6;
                pHVar23->name[6] = cVar7;
                *(undefined8 *)(pHVar23->name + 7) = uVar8;
                paVar27->is_dir = '\0';
                paVar27->seek = 0;
              }
              else if (header_ptr->is_dir != '\0') {
                pHVar23->comptype = '\x02';
                pHVar23->load = 0xfffddcff;
              }
              paVar27->header = pHVar23;
              if (paVar26 == (arcfs_header)0x0) {
                header_list = paVar27;
              }
              else {
                paVar26->next = paVar27;
                paVar27 = header_ptr;
              }
            }
            uVar25 = uVar25 + 1;
            paVar26 = paVar27;
          } while (uVar25 != local_48);
        }
        header_ptr = header_list;
        pHVar23 = header_list->header;
        if ((header_list->is_dir != '\0') ||
           (iVar15 = fseek((FILE *)ifp,(ulong)header_list->seek,0), iVar15 == 0)) goto LAB_00103ced;
        fmt = "Cannot seek compressed data in this file";
LAB_00103d0a:
        error(fmt);
      }
      else {
        error("Archive format %d not understood",(ulong)WVar18);
      }
    }
    else {
      error("Archive created by a newer version of ArcFS (%d.%02d)",(ulong)WVar18 / 100,
            (ulong)(WVar18 % 100));
    }
  }
  return &null_header;
}

Assistant:

Header *
arcfs_read_header(FILE *ifp)
{
	Word data_start;
	Word header_length = 0;
	Header *header;
	Word version;
	Word i;
	Byte info_byte, name[12];
	Word length, load, exec, attr, complen, info_word;
	arcfs_header header_prev = NULL;
	int j;

	/* Return next header from list */
	if (arcfs_initialised)
	{
		/* If end of list return an empty header structure to indicate EOF */
		if (header_ptr == NULL)
			return (&null_header);

		/* Return next header in list */
		header = header_ptr->header;
		/* Seek to start of compressed data */
		if ((!header_ptr->is_dir)
			&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
		{
			error("Cannot seek compressed data in this file");
			return (&null_header);
		}
		/* Set up number of compression bits */
		arcfs_maxbits = header_ptr->maxbits;
		/*if (header_ptr->is_dir) header = &null_header; */
		header_ptr = header_ptr->next;
		return (header);
	}

	/* Header list not constructed yet, so read all headers from file */
	arcfs_initialised = 1;
	memset((char *) &null_header, '\0', sizeof(null_header));
	null_header.comptype = 0;
	header_length = read_word(ifp);
	data_start = read_word(ifp);
	if ((version = read_word(ifp)) > 40)
	{
		/* BB removed floating point routines from next line
		   This saves linking the floating point routines under DOS
		   which yields quite a reduction in executable size.
		   And it removes the need to have the FPE present under RISC OS. */
		/* error("Archive created by a newer version of ArcFS (%.2f)",((float)version)/100); */
		error("Archive created by a newer version of ArcFS (%d.%02d)",
			   version / 100, version % 100);
		return (&null_header);
	}
	read_word(ifp);				/* read/write version */
	if ((version = read_word(ifp)) > 0)
	{
		error("Archive format %d not understood", version);
		return (&null_header);
	}
	for (i = 0; i < 17; i++)
		read_word(ifp);			/* reserved */

	/* Read list of headers */
	for (i = 0; i < header_length / 36; i++)
	{
		/* Create list item */
		header = (Header *) malloc(sizeof(Header));
		header_ptr = (arcfs_header) malloc(sizeof(struct arcfs_header_s));
		if ((header == NULL) || (header_ptr == NULL))
		{
			error("Out of memory");
			return (&null_header);
		}

		/* Read ArcFS file header */
		info_byte = read_byte(ifp);
		for (j = 0; j < 11; j++)
		{
			name[j] = read_byte(ifp);
			if (name[j] == PATHSEP)
				name[j] = '_';
			if (name[j] < ' ' || name[j] > '~')
				name[j] = '\0';
		}
		name[j] = '\0';
		length = read_word(ifp);
		load = read_word(ifp);
		exec = read_word(ifp);
		attr = read_word(ifp);
		complen = read_word(ifp);
		info_word = read_word(ifp);

		/* Examine, and create nspark header */
		if (info_byte == AFS_DELETED)
		{
			free(header);
			free(header_ptr);
			continue;
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->is_dir = (info_word >> 31); */
#ifdef __MSDOS__
		header_ptr->is_dir = (Halfword) (info_word >> 31);
#else
		header_ptr->is_dir = (info_word >> 31);
#endif
		header_ptr->info_byte = info_byte;
		header_ptr->info_word = info_word;
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->maxbits = (attr & 0xff00) >> 8; */
#ifdef __MSDOS__
		header_ptr->maxbits = (Halfword) (attr & 0xff00) >> 8;
#else
		header_ptr->maxbits = (attr & 0xff00) >> 8;
#endif
		/* BB changed constant in next line to long. */
		header_ptr->seek = (info_word & 0x7fffffffL) + data_start;
		header->comptype = info_byte;
		strcpy(header->name, (char *) name);
		header->complen = complen;
		header->date = 0;
		header->time = 0;
		header->crc = (Halfword) (attr >> 16);
		header->origlen = length;
		header->load = load;
		header->exec = exec;
		header->attr = attr & 0xff;

		arcfs_fixtime(header);

		if (info_byte == AFS_ENDDIR)
		{
			/* Just return comptype == 0 */
			*header = null_header;
			header_ptr->is_dir = 0;
			header_ptr->seek = 0;
		}

		/* If it is an ArcFS directory then convert to a Spark directory */
		if (header_ptr->is_dir)
		{
			/* Make sure filetype is DDC */
			header->comptype = CT_NOTCOMP2;
			/* BB changed constant in next line to long. */
			header->load = 0xfffddcffL;
		}

		/* Add list item to list */
		/* Doing it here ensures that deleted items are not added */
		header_ptr->header = header;
		if (header_prev)
			header_prev->next = header_ptr;
		else
			header_list = header_ptr;
		header_prev = header_ptr;
#ifdef DEBUGGING
		print_header(header);
#endif
	}

	/* Return first element */
	header_ptr = header_list;
	header = header_ptr->header;
	/* Seek to start of data for first element */
	if ((!header_ptr->is_dir)
		&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
	{
		error("Cannot seek compressed data in this file");
		return (&null_header);
	}
	/* Set up number of compression bits */
	arcfs_maxbits = header_ptr->maxbits;
	/*if (header_ptr->is_dir) header = &null_header; */
	header_ptr = header_ptr->next;
	return (header);
}